

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

void __thiscall
mp::BasicExprFactory<std::allocator<char>>::Deallocate<mp::Function::Impl_const*>
          (BasicExprFactory<std::allocator<char>_> *this,
          vector<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_> *data)

{
  bool bVar1;
  const_iterator __lhs;
  reference ppIVar2;
  const_iterator end;
  const_iterator i;
  Impl *in_stack_ffffffffffffffd8;
  __normal_iterator<const_mp::Function::Impl_*const_*,_std::vector<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (Impl **)std::vector<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>
                ::begin((vector<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>
                         *)in_stack_ffffffffffffffd8);
  __lhs = std::vector<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>::end
                    ((vector<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>
                      *)in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_mp::Function::Impl_*const_*,_std::vector<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<const_mp::Function::Impl_*const_*,_std::vector<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>_>
                        *)in_stack_ffffffffffffffd8);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<const_mp::Function::Impl_*const_*,_std::vector<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>_>
              ::operator*(local_18);
    in_stack_ffffffffffffffd8 = *ppIVar2;
    if (in_stack_ffffffffffffffd8 != (Impl *)0x0) {
      operator_delete__(in_stack_ffffffffffffffd8);
    }
    __gnu_cxx::
    __normal_iterator<const_mp::Function::Impl_*const_*,_std::vector<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>_>
    ::operator++(local_18);
  }
  return;
}

Assistant:

void BasicExprFactory<Alloc>::Deallocate(const std::vector<T> &data) {
  for (typename std::vector<T>::const_iterator
       i = data.begin(), end = data.end(); i != end; ++i) {
    delete [] (char*)*i;
  }
}